

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

ma_bool32 ma_dr_wav_init_memory_with_metadata
                    (ma_dr_wav *pWav,void *data,size_t dataSize,ma_uint32 flags,
                    ma_allocation_callbacks *pAllocationCallbacks)

{
  long in_RDX;
  ma_allocation_callbacks *in_RSI;
  void *in_RDI;
  ma_dr_wav_read_proc unaff_retaddr;
  ma_uint32 in_stack_00001214;
  void *in_stack_00001218;
  ma_dr_wav_chunk_proc in_stack_00001220;
  ma_dr_wav *in_stack_00001228;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  ma_bool32 mVar1;
  
  if ((in_RSI == (ma_allocation_callbacks *)0x0) || (in_RDX == 0)) {
    mVar1 = 0;
  }
  else {
    mVar1 = ma_dr_wav_preinit((ma_dr_wav *)pAllocationCallbacks,unaff_retaddr,
                              (ma_dr_wav_seek_proc)
                              CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),in_RDI,
                              in_RSI);
    if (mVar1 == 0) {
      mVar1 = 0;
    }
    else {
      *(ma_allocation_callbacks **)((long)in_RDI + 0xc0) = in_RSI;
      *(long *)((long)in_RDI + 200) = in_RDX;
      *(undefined8 *)((long)in_RDI + 0xd0) = 0;
      mVar1 = ma_dr_wav_init__internal
                        (in_stack_00001228,in_stack_00001220,in_stack_00001218,in_stack_00001214);
    }
  }
  return mVar1;
}

Assistant:

MA_API ma_bool32 ma_dr_wav_init_memory_with_metadata(ma_dr_wav* pWav, const void* data, size_t dataSize, ma_uint32 flags, const ma_allocation_callbacks* pAllocationCallbacks)
{
    if (data == NULL || dataSize == 0) {
        return MA_FALSE;
    }
    if (!ma_dr_wav_preinit(pWav, ma_dr_wav__on_read_memory, ma_dr_wav__on_seek_memory, pWav, pAllocationCallbacks)) {
        return MA_FALSE;
    }
    pWav->memoryStream.data = (const ma_uint8*)data;
    pWav->memoryStream.dataSize = dataSize;
    pWav->memoryStream.currentReadPos = 0;
    return ma_dr_wav_init__internal(pWav, NULL, NULL, flags | MA_DR_WAV_WITH_METADATA);
}